

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_regexp_Symbol_search(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  BOOL BVar1;
  int iVar2;
  JSValueUnion JVar3;
  JSValueUnion JVar4;
  ulong uVar5;
  int64_t iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  JSRefCountHeader *p_1;
  JSRefCountHeader *p_5;
  JSRefCountHeader *p;
  ulong uVar10;
  JSValue JVar11;
  JSValue op1;
  JSValue obj;
  JSValue op1_00;
  JSValueUnion local_58;
  JSValueUnion local_48;
  
  if ((int)this_val.tag == -1) {
    JVar11 = JS_ToStringInternal(ctx,*argv,0);
    JVar3 = JVar11.u;
    uVar9 = (uint)JVar11.tag;
    if (uVar9 == 6) {
      op1 = (JSValue)(ZEXT816(3) << 0x40);
LAB_0013fd00:
      op1_00 = (JSValue)(ZEXT816(3) << 0x40);
    }
    else {
      op1 = JS_GetPropertyInternal(ctx,this_val,0x55,this_val,0);
      JVar4 = op1.u;
      uVar7 = (uint)op1.tag;
      if (uVar7 == 6) {
        op1_00 = (JSValue)(ZEXT816(3) << 0x40);
      }
      else {
        if (0xfffffff4 < uVar7) {
          *(int *)JVar4.ptr = *JVar4.ptr + 1;
        }
        BVar1 = js_strict_eq2(ctx,op1,(JSValue)ZEXT816(0),JS_EQ_SAME_VALUE);
        if ((BVar1 == 0) &&
           (iVar2 = JS_SetPropertyInternal(ctx,this_val,0x55,(JSValue)ZEXT816(0),0x4000), iVar2 < 0)
           ) goto LAB_0013fd00;
        obj = JS_RegExpExec(ctx,this_val,JVar11);
        local_58 = obj.u;
        uVar8 = (uint)obj.tag;
        if ((obj.tag & 0xffffffffU) == 6) {
          op1_00 = (JSValue)(ZEXT816(3) << 0x40);
        }
        else {
          op1_00 = JS_GetPropertyInternal(ctx,this_val,0x55,this_val,0);
          if ((uint)op1_00.tag != 6) {
            BVar1 = js_same_value(ctx,op1_00,op1);
            if (BVar1 == 0) {
              iVar2 = JS_SetPropertyInternal(ctx,this_val,0x55,op1,0x4000);
              if (iVar2 < 0) {
                op1 = (JSValue)(ZEXT816(3) << 0x40);
                goto LAB_0013fe31;
              }
            }
            else if ((0xfffffff4 < uVar7) &&
                    (iVar2 = *JVar4.ptr, *(int *)JVar4.ptr = iVar2 + -1, iVar2 < 2)) {
              __JS_FreeValueRT(ctx->rt,op1);
            }
            local_48 = op1_00.u;
            if ((0xfffffff4 < uVar9) &&
               (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar11);
            }
            if ((0xfffffff4 < (uint)op1_00.tag) &&
               (iVar2 = *local_48.ptr, *(int *)local_48.ptr = iVar2 + -1, iVar2 < 2)) {
              __JS_FreeValueRT(ctx->rt,op1_00);
            }
            if (uVar8 == 2) {
              uVar10 = 0xffffffff;
              uVar5 = 0;
              iVar6 = 0;
            }
            else {
              JVar11 = JS_GetPropertyInternal(ctx,obj,0x57,obj,0);
              iVar6 = JVar11.tag;
              if ((0xfffffff4 < uVar8) &&
                 (iVar2 = *local_58.ptr, *(int *)local_58.ptr = iVar2 + -1, iVar2 < 2)) {
                __JS_FreeValueRT(ctx->rt,obj);
              }
              uVar5 = (ulong)JVar11.u.ptr & 0xffffffff00000000;
              uVar10 = (ulong)JVar11.u.ptr & 0xffffffff;
            }
            goto LAB_0013fecf;
          }
        }
LAB_0013fe31:
        if ((0xfffffff4 < uVar8) &&
           (iVar2 = *local_58.ptr, *(int *)local_58.ptr = iVar2 + -1, iVar2 < 2)) {
          __JS_FreeValueRT(ctx->rt,obj);
        }
      }
    }
    if ((0xfffffff4 < uVar9) && (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar11);
    }
    if ((0xfffffff4 < (uint)op1_00.tag) &&
       (iVar2 = *op1_00.u.ptr, *(int *)op1_00.u.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,op1_00);
    }
    if ((0xfffffff4 < (uint)op1.tag) &&
       (iVar2 = *op1.u.ptr, *(int *)op1.u.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,op1);
    }
  }
  else {
    JS_ThrowTypeError(ctx,"not an object");
  }
  uVar10 = 0;
  iVar6 = 6;
  uVar5 = 0;
LAB_0013fecf:
  JVar11.tag = iVar6;
  JVar11.u.ptr = (void *)(uVar10 | uVar5);
  return JVar11;
}

Assistant:

static JSValue js_regexp_Symbol_search(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    JSValueConst rx = this_val;
    JSValue str, previousLastIndex, currentLastIndex, result, index;

    if (!JS_IsObject(rx))
        return JS_ThrowTypeErrorNotAnObject(ctx);

    result = JS_UNDEFINED;
    currentLastIndex = JS_UNDEFINED;
    previousLastIndex = JS_UNDEFINED;
    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        goto exception;

    previousLastIndex = JS_GetProperty(ctx, rx, JS_ATOM_lastIndex);
    if (JS_IsException(previousLastIndex))
        goto exception;

    if (!js_same_value(ctx, previousLastIndex, JS_NewInt32(ctx, 0))) {
        if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, JS_NewInt32(ctx, 0)) < 0) {
            goto exception;
        }
    }
    result = JS_RegExpExec(ctx, rx, str);
    if (JS_IsException(result))
        goto exception;
    currentLastIndex = JS_GetProperty(ctx, rx, JS_ATOM_lastIndex);
    if (JS_IsException(currentLastIndex))
        goto exception;
    if (js_same_value(ctx, currentLastIndex, previousLastIndex)) {
        JS_FreeValue(ctx, previousLastIndex);
    } else {
        if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, previousLastIndex) < 0) {
            previousLastIndex = JS_UNDEFINED;
            goto exception;
        }
    }
    JS_FreeValue(ctx, str);
    JS_FreeValue(ctx, currentLastIndex);

    if (JS_IsNull(result)) {
        return JS_NewInt32(ctx, -1);
    } else {
        index = JS_GetProperty(ctx, result, JS_ATOM_index);
        JS_FreeValue(ctx, result);
        return index;
    }

exception:
    JS_FreeValue(ctx, result);
    JS_FreeValue(ctx, str);
    JS_FreeValue(ctx, currentLastIndex);
    JS_FreeValue(ctx, previousLastIndex);
    return JS_EXCEPTION;
}